

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O3

int QTest::qExec(QObject *testObject,QStringList *arguments)

{
  Data *pDVar1;
  int iVar2;
  ulong uVar3;
  iterator iVar4;
  ulong __size;
  char *pcVar5;
  uint argc;
  long lVar6;
  size_t totalCapacity;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QArrayData *local_898;
  char *local_890;
  QByteArray local_880;
  QArrayDataPointer<QByteArray> local_868;
  ulong local_850;
  ulong local_848;
  char **local_840;
  char *local_838 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (arguments->d).size;
  memset(local_838,0xaa,0x800);
  argc = (uint)lVar6;
  uVar7 = (ulong)(int)argc;
  local_850 = 0x100;
  local_848 = 0;
  local_840 = local_838;
  if ((long)uVar7 < 0x101) {
LAB_0012fded:
    local_868.d = (Data *)0x0;
    local_868.ptr = (QByteArray *)0x0;
    local_868.size = 0;
    local_848 = uVar7;
    QList<QByteArray>::reserve((QList<QByteArray> *)&local_868,uVar7);
    if (0 < (int)argc) {
      lVar6 = 2;
      uVar7 = 0;
      do {
        QString::toLocal8Bit_helper
                  ((QChar *)&local_898,*(longlong *)((long)(arguments->d).ptr + lVar6 * 8 + -8));
        pcVar5 = local_890;
        if (local_890 == (char *)0x0) {
          pcVar5 = (char *)&QByteArray::_empty;
        }
        QByteArray::QByteArray(&local_880,pcVar5,-1);
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                  ((QMovableArrayOps<QByteArray> *)&local_868,local_868.size,&local_880);
        QList<QByteArray>::end((QList<QByteArray> *)&local_868);
        if (&(local_880.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_880.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_880.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_880.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_880.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (local_898 != (QArrayData *)0x0) {
          LOCK();
          (local_898->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_898->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_898->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_898,1,0x10);
          }
        }
        iVar4 = QList<QByteArray>::end((QList<QByteArray> *)&local_868);
        pDVar1 = iVar4.i[-1].d.d;
        if ((pDVar1 == (Data *)0x0) ||
           (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData((longlong)(iVar4.i + -1),(AllocationOption)iVar4.i[-1].d.size);
        }
        local_840[uVar7] = iVar4.i[-1].d.ptr;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 3;
      } while ((argc & 0x7fffffff) != uVar7);
    }
    qInit(testObject,argc,local_840);
    iVar2 = qRun();
    qCleanup();
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_868);
    if (local_840 != local_838) {
      QtPrivate::sizedFree(local_840,local_850 << 3);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar2;
    }
  }
  else {
    __size = (ulong)(lVar6 << 0x20) >> 0x1d;
    local_850 = uVar7;
    uVar3 = QtPrivate::expectedAllocSize(__size,0x10);
    uVar8 = uVar7;
    if (uVar3 == 0) {
LAB_0012fdd2:
      local_840 = (char **)malloc(__size);
      local_850 = uVar8;
      if (local_840 != (char **)0x0) goto LAB_0012fded;
    }
    else {
      uVar8 = uVar3 >> 3;
      __size = uVar3 & 0xfffffffffffffff8;
      if (__size != 0) goto LAB_0012fdd2;
      local_840 = (char **)0x0;
      local_850 = uVar8;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      qBadAlloc();
    }
  }
  __stack_chk_fail();
}

Assistant:

int QTest::qExec(QObject *testObject, const QStringList &arguments)
{
    const int argc = arguments.size();
    QVarLengthArray<char *> argv(argc);

    QList<QByteArray> args;
    args.reserve(argc);

    for (int i = 0; i < argc; ++i)
    {
        args.append(arguments.at(i).toLocal8Bit().constData());
        argv[i] = args.last().data();
    }

    return qExec(testObject, argc, argv.data());
}